

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O0

void __thiscall OpenMD::NVT::moveA(NVT *this)

{
  bool bVar1;
  Snapshot *in_RDI;
  RealType instTemp;
  pair<double,_double> thermostat;
  Vector3d frc;
  Vector3d pos;
  Vector3d vel;
  RealType mass;
  Vector3d ji;
  Vector3d Tb;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  StuntDouble *in_stack_fffffffffffffdf8;
  StuntDouble *in_stack_fffffffffffffe08;
  StuntDouble *in_stack_fffffffffffffe10;
  iterator *in_stack_fffffffffffffe18;
  SimInfo *in_stack_fffffffffffffe20;
  Vector3d *in_stack_fffffffffffffe80;
  StuntDouble *in_stack_fffffffffffffe88;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x298e73);
  Vector3<double>::Vector3((Vector3<double> *)0x298e80);
  Vector3<double>::Vector3((Vector3<double> *)0x298e8d);
  Vector3<double>::Vector3((Vector3<double> *)0x298e9a);
  Vector3<double>::Vector3((Vector3<double> *)0x298ea7);
  Snapshot::getThermostat
            ((Snapshot *)
             (in_RDI->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  Thermo::getTemperature((Thermo *)in_stack_fffffffffffffe20);
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffe20,(MoleculeIterator *)in_stack_fffffffffffffe18);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffe08);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffdf8);
      StuntDouble::getPos(in_stack_fffffffffffffe08);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffdf8);
      StuntDouble::getFrc(in_stack_fffffffffffffe08);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffdf8);
      StuntDouble::getMass(local_28);
      OpenMD::operator*((double)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI);
      OpenMD::operator*((double)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI
                       );
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffdf8);
      OpenMD::operator*((double)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffdf8);
      StuntDouble::setVel(in_stack_fffffffffffffe10,(Vector3d *)in_stack_fffffffffffffe08);
      StuntDouble::setPos(in_stack_fffffffffffffe10,(Vector3d *)in_stack_fffffffffffffe08);
      bVar1 = StuntDouble::isDirectional((StuntDouble *)in_RDI);
      if (bVar1) {
        StuntDouble::getTrq(in_stack_fffffffffffffe08);
        StuntDouble::lab2Body(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector3<double> *)local_28);
        StuntDouble::getJ(in_stack_fffffffffffffe08);
        Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector3<double> *)local_28);
        OpenMD::operator*((double)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI);
        OpenMD::operator*((double)in_stack_fffffffffffffe08,(Vector<double,_3U> *)in_RDI);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffe08,
                          (Vector<double,_3U> *)in_RDI);
        Vector<double,_3U>::operator+=((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)local_28);
        RotationAlgorithm::rotate
                  ((RotationAlgorithm *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (Vector3d *)in_RDI,(RealType)local_28);
        StuntDouble::setJ(in_stack_fffffffffffffe10,(Vector3d *)in_stack_fffffffffffffe08);
        in_stack_fffffffffffffdf8 = local_28;
      }
      local_28 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    local_20 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffe20,(MoleculeIterator *)in_stack_fffffffffffffe18);
  }
  (**(code **)((long)*(in_RDI->atomData).particlePot.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x20))();
  Rattle::constraintA((Rattle *)in_stack_fffffffffffffe10);
  Snapshot::setThermostat(in_RDI,(pair<double,_double> *)in_stack_fffffffffffffdf8);
  return;
}

Assistant:

void NVT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;

    pair<RealType, RealType> thermostat = snap->getThermostat();

    // We need the temperature at time = t for the chi update below:

    RealType instTemp = thermo.getTemperature();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        pos = sd->getPos();
        frc = sd->getFrc();

        mass = sd->getMass();

        // velocity half step (use chi from previous step here):
        vel += dt2 * Constants::energyConvert / mass * frc -
               dt2 * thermostat.first * vel;

        // position whole step
        pos += dt * vel;

        sd->setVel(vel);
        sd->setPos(pos);

        if (sd->isDirectional()) {
          // convert the torque to body frame
          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }

    flucQ_->moveA();
    rattle_->constraintA();

    // Finally, evolve chi a half step (just like a velocity) using
    // temperature at time t, not time t+dt/2

    thermostat.first += dt2 * (instTemp / targetTemp_ - 1.0) /
                        (tauThermostat_ * tauThermostat_);
    thermostat.second += thermostat.first * dt2;

    snap->setThermostat(thermostat);
  }